

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O2

int fy_atom_iter_utf8_get(fy_atom_iter *iter)

{
  uint uVar1;
  uint8_t in_EAX [4];
  int left;
  ssize_t sVar2;
  ulong uVar3;
  uint uVar4;
  uint8_t buf [4];
  int w;
  
  uVar4 = 0xffffffff;
  if (iter != (fy_atom_iter *)0x0) {
    uVar1 = iter->unget_c;
    if (uVar1 == 0xffffffff) {
      buf = in_EAX;
      sVar2 = fy_atom_iter_read(iter,buf,1);
      if (sVar2 == 1) {
        left = fy_utf8_width_by_first_octet(buf[0]);
        _buf = CONCAT44(left,buf);
        if (left != 0) {
          if ((left != 1) &&
             (uVar3 = fy_atom_iter_read(iter,buf + 1,(ulong)(left - 1)), uVar3 != left - 1)) {
            return -1;
          }
          uVar4 = fy_utf8_get(buf,left,&w);
        }
      }
    }
    else {
      iter->unget_c = -1;
      uVar4 = uVar1 & 0xff;
    }
  }
  return uVar4;
}

Assistant:

int fy_atom_iter_utf8_get(struct fy_atom_iter *iter) {
    uint8_t buf[4];    /* maximum utf8 is 4 octets */
    ssize_t nread;
    int c, w;

    if (!iter)
        return -1;

    /* first try the pushed ungetc */
    if (iter->unget_c != -1) {
        c = iter->unget_c;
        iter->unget_c = -1;
        return c & 0xff;
    }

    /* read first octet */
    nread = fy_atom_iter_read(iter, &buf[0], 1);
    if (nread != 1)
        return -1;

    /* get width from it (0 means illegal) */
    w = fy_utf8_width_by_first_octet(buf[0]);
    if (!w)
        return -1;

    /* read the rest octets (if possible) */
    if (w > 1) {
        nread = fy_atom_iter_read(iter, buf + 1, w - 1);
        if (nread != (w - 1))
            return -1;
    }

    /* and return the decoded utf8 character */
    return fy_utf8_get(buf, w, &w);
}